

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O0

FT_Error FT_Outline_Check(FT_Outline *outline)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_2c;
  FT_Int n;
  FT_Int end;
  FT_Int end0;
  FT_Int n_contours;
  FT_Int n_points;
  FT_Outline *outline_local;
  
  if (outline != (FT_Outline *)0x0) {
    iVar1 = (int)outline->n_points;
    iVar2 = (int)outline->n_contours;
    if ((iVar1 == 0) && (iVar2 == 0)) {
      return 0;
    }
    if ((0 < iVar1) && (0 < iVar2)) {
      n = -1;
      for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
        iVar3 = (int)outline->contours[local_2c];
        if (iVar3 <= n) {
          return 6;
        }
        if (iVar1 <= iVar3) {
          return 6;
        }
        n = iVar3;
      }
      if (n == iVar1 + -1) {
        return 0;
      }
    }
  }
  return 6;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Check( FT_Outline*  outline )
  {
    if ( outline )
    {
      FT_Int  n_points   = outline->n_points;
      FT_Int  n_contours = outline->n_contours;
      FT_Int  end0, end;
      FT_Int  n;


      /* empty glyph? */
      if ( n_points == 0 && n_contours == 0 )
        return FT_Err_Ok;

      /* check point and contour counts */
      if ( n_points <= 0 || n_contours <= 0 )
        goto Bad;

      end0 = end = -1;
      for ( n = 0; n < n_contours; n++ )
      {
        end = outline->contours[n];

        /* note that we don't accept empty contours */
        if ( end <= end0 || end >= n_points )
          goto Bad;

        end0 = end;
      }

      if ( end != n_points - 1 )
        goto Bad;

      /* XXX: check the tags array */
      return FT_Err_Ok;
    }

  Bad:
    return FT_THROW( Invalid_Argument );
  }